

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

bool __thiscall QHttpMultiPartIODevice::reset(QHttpMultiPartIODevice *this)

{
  bool bVar1;
  qsizetype qVar2;
  long i;
  QHttpPartPrivate *in_RDI;
  int a;
  int local_14;
  
  QIODevice::reset();
  local_14 = 0;
  while( true ) {
    i = (long)local_14;
    qVar2 = QList<QHttpPart>::size
                      ((QList<QHttpPart> *)
                       &(in_RDI->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.ptr[2].
                        second);
    if (qVar2 <= i) {
      (in_RDI->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.size = 0;
      return true;
    }
    QList<QHttpPart>::operator[]((QList<QHttpPart> *)in_RDI,i);
    QSharedDataPointer<QHttpPartPrivate>::operator->((QSharedDataPointer<QHttpPartPrivate> *)in_RDI)
    ;
    bVar1 = QHttpPartPrivate::reset(in_RDI);
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool QHttpMultiPartIODevice::reset()
{
    // Reset QIODevice's data
    QIODevice::reset();
    for (int a = 0; a < multiPart->parts.size(); a++)
        if (!multiPart->parts[a].d->reset())
            return false;
    readPointer = 0;
    return true;
}